

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O1

void sm_setProperty(QString *name,QString *value)

{
  long in_FS_OFFSET;
  QString local_90;
  undefined4 local_78;
  undefined4 uStack_74;
  char16_t *pcStack_70;
  QString local_68;
  char16_t *local_48;
  char *pcStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 *puStack_30;
  char16_t **local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toUtf8_helper(&local_68);
  _local_78 = CONCAT44(0xaaaaaaaa,(undefined4)local_68.d.size);
  pcStack_70 = local_68.d.ptr;
  if (local_68.d.ptr == (char16_t *)0x0) {
    pcStack_70 = (char16_t *)&QByteArray::_empty;
  }
  QString::toLatin1_helper(&local_90);
  if ((&(local_90.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_90,(AllocationOption)local_90.d.size);
  }
  local_20 = &local_48;
  uStack_34 = 0xaaaaaaaa;
  local_48 = local_90.d.ptr;
  pcStack_40 = "ARRAY8";
  local_38 = 1;
  puStack_30 = &local_78;
  SmcSetProperties(smcConnection,1);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sm_setProperty(const QString &name, const QString &value)
{
    QByteArray v = value.toUtf8();
    SmPropValue prop;
    prop.length = v.size();
    prop.value = (SmPointer) const_cast<char *>(v.constData());
    sm_setProperty(name.toLatin1().data(), SmARRAY8, 1, &prop);
}